

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_util.cpp
# Opt level: O1

void duckdb::ExtensionUtil::RegisterCollation(DatabaseInstance *db,CreateCollationInfo *info)

{
  scalar_function_t *this;
  CatalogTransaction transaction;
  CatalogTransaction transaction_00;
  Catalog *this_00;
  long lVar1;
  bind_scalar_function_t *pp_Var2;
  bind_scalar_function_t *pp_Var3;
  byte bVar4;
  CatalogTransaction data;
  CreateScalarFunctionInfo finfo;
  CatalogTransaction local_328;
  ScalarFunction local_300;
  CreateScalarFunctionInfo local_1d8;
  
  bVar4 = 0;
  this_00 = Catalog::GetSystemCatalog(db);
  CatalogTransaction::GetSystemTransaction(&local_328,db);
  (info->super_CreateInfo).on_conflict = IGNORE_ON_CONFLICT;
  transaction.context.ptr = local_328.context.ptr;
  transaction.db.ptr = local_328.db.ptr;
  transaction.transaction.ptr = local_328.transaction.ptr;
  transaction.transaction_id = local_328.transaction_id;
  transaction.start_time = local_328.start_time;
  Catalog::CreateCollation(this_00,transaction,info);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_300,(SimpleFunction *)&info->function);
  local_300.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_019937c0;
  LogicalType::LogicalType
            (&local_300.super_BaseScalarFunction.return_type,
             &(info->function).super_BaseScalarFunction.return_type);
  local_300.super_BaseScalarFunction.stability = (info->function).super_BaseScalarFunction.stability
  ;
  local_300.super_BaseScalarFunction.null_handling =
       (info->function).super_BaseScalarFunction.null_handling;
  local_300.super_BaseScalarFunction.errors = (info->function).super_BaseScalarFunction.errors;
  local_300.super_BaseScalarFunction.collation_handling =
       (info->function).super_BaseScalarFunction.collation_handling;
  this = &local_300.function;
  local_300.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (this,&(info->function).function);
  pp_Var2 = &(info->function).bind;
  pp_Var3 = &local_300.bind;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pp_Var3 = *pp_Var2;
    pp_Var2 = pp_Var2 + (ulong)bVar4 * -2 + 1;
    pp_Var3 = pp_Var3 + (ulong)bVar4 * -2 + 1;
  }
  local_300.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (info->function).function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_300.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (info->function).function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_300.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_300.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_300.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_300.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_300.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  CreateScalarFunctionInfo::CreateScalarFunctionInfo(&local_1d8,&local_300);
  local_300.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_300.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_300.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_300.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_300.function.super__Function_base._M_manager)
              ((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_300.super_BaseScalarFunction);
  local_1d8.super_CreateFunctionInfo.super_CreateInfo.on_conflict = IGNORE_ON_CONFLICT;
  transaction_00.context.ptr = local_328.context.ptr;
  transaction_00.db.ptr = local_328.db.ptr;
  transaction_00.transaction.ptr = local_328.transaction.ptr;
  transaction_00.transaction_id = local_328.transaction_id;
  transaction_00.start_time = local_328.start_time;
  Catalog::CreateFunction(this_00,transaction_00,&local_1d8.super_CreateFunctionInfo);
  local_1d8.super_CreateFunctionInfo.super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateScalarFunctionInfo_019b1110;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
            (&local_1d8.functions.super_FunctionSet<duckdb::ScalarFunction>.functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.functions.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p !=
      &local_1d8.functions.super_FunctionSet<duckdb::ScalarFunction>.name.field_2) {
    operator_delete(local_1d8.functions.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus.
                    _M_p);
  }
  local_1d8.super_CreateFunctionInfo.super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateFunctionInfo_01996630;
  ::std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::~vector
            (&local_1d8.super_CreateFunctionInfo.descriptions.
              super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.super_CreateFunctionInfo.alias_of._M_dataplus._M_p !=
      &local_1d8.super_CreateFunctionInfo.alias_of.field_2) {
    operator_delete(local_1d8.super_CreateFunctionInfo.alias_of._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.super_CreateFunctionInfo.name._M_dataplus._M_p !=
      &local_1d8.super_CreateFunctionInfo.name.field_2) {
    operator_delete(local_1d8.super_CreateFunctionInfo.name._M_dataplus._M_p);
  }
  CreateInfo::~CreateInfo((CreateInfo *)&local_1d8);
  return;
}

Assistant:

void ExtensionUtil::RegisterCollation(DatabaseInstance &db, CreateCollationInfo &info) {
	auto &system_catalog = Catalog::GetSystemCatalog(db);
	auto data = CatalogTransaction::GetSystemTransaction(db);
	info.on_conflict = OnCreateConflict::IGNORE_ON_CONFLICT;
	system_catalog.CreateCollation(data, info);

	// Also register as a function for serialisation
	CreateScalarFunctionInfo finfo(info.function);
	finfo.on_conflict = OnCreateConflict::IGNORE_ON_CONFLICT;
	system_catalog.CreateFunction(data, finfo);
}